

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

uint64_t replace_bits(uint64_t msrval,uint64_t data,uint8_t first,uint8_t last)

{
  ulong uVar1;
  uint64_t mask;
  uint8_t last_local;
  uint8_t first_local;
  uint64_t data_local;
  uint64_t msrval_local;
  
  if (last < first) {
    __assert_fail("first <= last",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x1df,"uint64_t replace_bits(uint64_t, uint64_t, uint8_t, uint8_t)");
  }
  if (last < 0x40) {
    uVar1 = (1L << ((last - first) + 1 & 0x3f)) + -1 << (first & 0x3f);
    return msrval & (uVar1 ^ 0xffffffffffffffff) | data << (first & 0x3f) & uVar1;
  }
  __assert_fail("last < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x1e0,"uint64_t replace_bits(uint64_t, uint64_t, uint8_t, uint8_t)");
}

Assistant:

static uint64_t replace_bits(uint64_t msrval, uint64_t data, uint8_t first, uint8_t last) {
  assert(first <= last);
  assert(last < 64);
  const uint64_t mask = (((uint64_t) 1 << (last - first + 1)) - 1) << first;
  return (msrval & ~mask) | ((data << first) & mask);
}